

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall
BackwardPass::InstrPreservesNumberValues(BackwardPass *this,Instr *instr,Sym *defSym)

{
  bool bVar1;
  Opnd *pOVar2;
  RegOpnd *pRVar3;
  bool local_32;
  bool local_31;
  RegOpnd *src1;
  Sym *defSym_local;
  Instr *instr_local;
  BackwardPass *this_local;
  
  defSym_local = (Sym *)instr;
  if (instr->m_opcode == Ld_A) {
    pOVar2 = IR::Instr::GetSrc1(instr);
    bVar1 = IR::Opnd::IsRegOpnd(pOVar2);
    if (bVar1) {
      pOVar2 = IR::Instr::GetSrc1(instr);
      pRVar3 = IR::Opnd::AsRegOpnd(pOVar2);
      bVar1 = StackSym::IsSingleDef(pRVar3->m_sym);
      if (bVar1) {
        defSym_local = (Sym *)StackSym::GetInstrDef(pRVar3->m_sym);
      }
    }
  }
  bVar1 = OpCodeAttr::ProducesNumber(*(OpCode *)&defSym_local[2]._vptr_Sym);
  local_31 = true;
  if (!bVar1) {
    local_32 = false;
    if (*(short *)&defSym_local[2]._vptr_Sym == 0x2d) {
      pOVar2 = IR::Instr::GetSrc1((Instr *)defSym_local);
      bVar1 = SymIsIntconstOrSelf(this,defSym,pOVar2);
      local_32 = false;
      if (bVar1) {
        pOVar2 = IR::Instr::GetSrc2((Instr *)defSym_local);
        local_32 = SymIsIntconstOrSelf(this,defSym,pOVar2);
      }
    }
    local_31 = local_32;
  }
  return local_31;
}

Assistant:

bool
BackwardPass::InstrPreservesNumberValues(IR::Instr *instr, Sym *defSym)
{
    if (instr->m_opcode == Js::OpCode::Ld_A)
    {
        if (instr->GetSrc1()->IsRegOpnd())
        {
            IR::RegOpnd *src1 = instr->GetSrc1()->AsRegOpnd();
            if (src1->m_sym->IsSingleDef())
            {
                instr = src1->m_sym->GetInstrDef();
            }
        }
    }
    return (OpCodeAttr::ProducesNumber(instr->m_opcode) ||
        (instr->m_opcode == Js::OpCode::Add_A && this->SymIsIntconstOrSelf(defSym, instr->GetSrc1()) && this->SymIsIntconstOrSelf(defSym, instr->GetSrc2())));
}